

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_parser_hlsl.h
# Opt level: O3

void yy_shift(yyParser *yypParser,int yyNewState,int yyMajor,YYMINORTYPE *yypMinor)

{
  int iVar1;
  Context_conflict *ctx;
  long lVar2;
  
  iVar1 = yypParser->yyidx;
  lVar2 = (long)iVar1;
  yypParser->yyidx = iVar1 + 1;
  if (lVar2 < 99) {
    yypParser->yystack[lVar2 + 1].stateno = (unsigned_short)yyNewState;
    yypParser->yystack[lVar2 + 1].major = (uchar)yyMajor;
    yypParser->yystack[lVar2 + 1].minor = *yypMinor;
  }
  else {
    ctx = yypParser->ctx;
    yypParser->yyidx = iVar1;
    do {
      yy_pop_parser_stack(yypParser);
    } while (-1 < yypParser->yyidx);
    failf(ctx,"%s","Giving up. Parser stack overflow");
    yypParser->ctx = ctx;
  }
  return;
}

Assistant:

static void yy_shift(
  yyParser *yypParser,          /* The parser to be shifted */
  int yyNewState,               /* The new state to shift in */
  int yyMajor,                  /* The major token to shift in */
  YYMINORTYPE *yypMinor         /* Pointer to the minor token to shift in */
){
  yyStackEntry *yytos;
  yypParser->yyidx++;
#ifdef YYTRACKMAXSTACKDEPTH
  if( yypParser->yyidx>yypParser->yyidxMax ){
    yypParser->yyidxMax = yypParser->yyidx;
  }
#endif
#if YYSTACKDEPTH>0 
  if( yypParser->yyidx>=YYSTACKDEPTH ){
    yyStackOverflow(yypParser, yypMinor);
    return;
  }
#else
  if( yypParser->yyidx>=yypParser->yystksz ){
    yyGrowStack(yypParser);
    if( yypParser->yyidx>=yypParser->yystksz ){
      yyStackOverflow(yypParser, yypMinor);
      return;
    }
  }
#endif
  yytos = &yypParser->yystack[yypParser->yyidx];
  yytos->stateno = (YYACTIONTYPE)yyNewState;
  yytos->major = (YYCODETYPE)yyMajor;
  yytos->minor = *yypMinor;
#if LEMON_SUPPORT_TRACING   /* __MOJOSHADER__ */
  if( yyTraceFILE && yypParser->yyidx>0 ){
    int i;
    fprintf(yyTraceFILE,"%sShift %d\n",yyTracePrompt,yyNewState);
    fprintf(yyTraceFILE,"%sStack:",yyTracePrompt);
    for(i=1; i<=yypParser->yyidx; i++)
      fprintf(yyTraceFILE," %s",yyTokenName[yypParser->yystack[i].major]);
    fprintf(yyTraceFILE,"\n");
  }
#endif
}